

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Expression::visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
          (Expression *this,Expression *expr,ExpressionPrinter *visitor)

{
  logic_error *this_00;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ExpressionPrinter *local_20;
  ExpressionPrinter *visitor_local;
  Expression *expr_local;
  Expression *this_local;
  
  local_20 = visitor;
  visitor_local = (ExpressionPrinter *)expr;
  expr_local = this;
  switch(expr->kind) {
  case Invalid:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visitInvalid
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,expr);
    break;
  case IntegerLiteral:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::IntegerLiteral>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (IntegerLiteral *)expr);
    break;
  case RealLiteral:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::RealLiteral>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,(RealLiteral *)expr)
    ;
    break;
  case TimeLiteral:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::TimeLiteral>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,(TimeLiteral *)expr)
    ;
    break;
  case UnbasedUnsizedIntegerLiteral:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::UnbasedUnsizedIntegerLiteral>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (UnbasedUnsizedIntegerLiteral *)expr);
    break;
  case NullLiteral:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::NullLiteral>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,(NullLiteral *)expr)
    ;
    break;
  case UnboundedLiteral:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::UnboundedLiteral>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (UnboundedLiteral *)expr);
    break;
  case StringLiteral:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::StringLiteral>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (StringLiteral *)expr);
    break;
  case NamedValue:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::NamedValueExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (NamedValueExpression *)expr);
    break;
  case HierarchicalValue:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::HierarchicalValueExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (HierarchicalValueExpression *)expr);
    break;
  case UnaryOp:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::UnaryExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (UnaryExpression *)expr);
    break;
  case BinaryOp:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::BinaryExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (BinaryExpression *)expr);
    break;
  case ConditionalOp:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::ConditionalExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (ConditionalExpression *)expr);
    break;
  case Inside:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::InsideExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (InsideExpression *)expr);
    break;
  case Assignment:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::AssignmentExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (AssignmentExpression *)expr);
    break;
  case Concatenation:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::ConcatenationExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (ConcatenationExpression *)expr);
    break;
  case Replication:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::ReplicationExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (ReplicationExpression *)expr);
    break;
  case Streaming:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::StreamingConcatenationExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (StreamingConcatenationExpression *)expr);
    break;
  case ElementSelect:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::ElementSelectExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (ElementSelectExpression *)expr);
    break;
  case RangeSelect:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::RangeSelectExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (RangeSelectExpression *)expr);
    break;
  case MemberAccess:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::MemberAccessExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (MemberAccessExpression *)expr);
    break;
  case Call:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::CallExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (CallExpression *)expr);
    break;
  case Conversion:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::ConversionExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (ConversionExpression *)expr);
    break;
  case DataType:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::DataTypeExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (DataTypeExpression *)expr);
    break;
  case TypeReference:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::TypeReferenceExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (TypeReferenceExpression *)expr);
    break;
  case HierarchicalReference:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::HierarchicalReferenceExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (HierarchicalReferenceExpression *)expr);
    break;
  case LValueReference:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::LValueReferenceExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (LValueReferenceExpression *)expr);
    break;
  case SimpleAssignmentPattern:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::SimpleAssignmentPatternExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (SimpleAssignmentPatternExpression *)expr);
    break;
  case StructuredAssignmentPattern:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::StructuredAssignmentPatternExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (StructuredAssignmentPatternExpression *)expr);
    break;
  case ReplicatedAssignmentPattern:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::ReplicatedAssignmentPatternExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (ReplicatedAssignmentPatternExpression *)expr);
    break;
  case EmptyArgument:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::EmptyArgumentExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (EmptyArgumentExpression *)expr);
    break;
  case OpenRange:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::OpenRangeExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (OpenRangeExpression *)expr);
    break;
  case Dist:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::DistExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (DistExpression *)expr);
    break;
  case NewArray:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::NewArrayExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (NewArrayExpression *)expr);
    break;
  case NewClass:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::NewClassExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (NewClassExpression *)expr);
    break;
  case NewCovergroup:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::NewCovergroupExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (NewCovergroupExpression *)expr);
    break;
  case CopyClass:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::CopyClassExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (CopyClassExpression *)expr);
    break;
  case MinTypMax:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::MinTypMaxExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (MinTypMaxExpression *)expr);
    break;
  case ClockingEvent:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::ClockingEventExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (ClockingEventExpression *)expr);
    break;
  case AssertionInstance:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::
    visit<slang::ast::AssertionInstanceExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (AssertionInstanceExpression *)expr);
    break;
  case TaggedUnion:
    ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true>::visit<slang::ast::TaggedUnionExpression>
              ((ASTVisitor<hgdb::rtl::ExpressionPrinter,_false,_true> *)visitor,
               (TaggedUnionExpression *)expr);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_c1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_f8,0x15b);
    std::operator+(&local_80,&local_a0,&local_f8);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}